

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtHashMap.h
# Opt level: O3

void __thiscall
cbtHashMap<cbtInternalVertexPair,_cbtInternalEdge>::insert
          (cbtHashMap<cbtInternalVertexPair,_cbtInternalEdge> *this,cbtInternalVertexPair *key,
          cbtInternalEdge *value)

{
  short sVar1;
  short sVar2;
  int iVar3;
  uint uVar4;
  cbtInternalEdge *ptr;
  cbtInternalVertexPair *ptr_00;
  int *piVar5;
  int iVar6;
  uint uVar7;
  cbtInternalEdge *pcVar8;
  cbtInternalVertexPair *pcVar9;
  ulong uVar10;
  uint uVar11;
  int sz;
  
  sVar1 = key->m_v0;
  sVar2 = key->m_v1;
  iVar3 = (this->m_valueArray).m_capacity;
  iVar6 = findIndex(this,key);
  if (iVar6 == -1) {
    uVar4 = (this->m_valueArray).m_size;
    uVar11 = (this->m_valueArray).m_capacity;
    uVar7 = uVar4;
    if (uVar4 == uVar11) {
      iVar6 = 1;
      if (uVar4 != 0) {
        iVar6 = uVar4 * 2;
      }
      if ((int)uVar4 < iVar6) {
        if (iVar6 == 0) {
          pcVar8 = (cbtInternalEdge *)0x0;
        }
        else {
          pcVar8 = (cbtInternalEdge *)cbtAlignedAllocInternal((long)iVar6 << 2,0x10);
          uVar7 = (this->m_valueArray).m_size;
        }
        if (0 < (int)uVar7) {
          uVar10 = 0;
          do {
            pcVar8[uVar10] = (this->m_valueArray).m_data[uVar10];
            uVar10 = uVar10 + 1;
          } while (uVar7 != uVar10);
        }
        ptr = (this->m_valueArray).m_data;
        if ((ptr != (cbtInternalEdge *)0x0) && ((this->m_valueArray).m_ownsMemory == true)) {
          cbtAlignedFreeInternal(ptr);
        }
        (this->m_valueArray).m_ownsMemory = true;
        (this->m_valueArray).m_data = pcVar8;
        (this->m_valueArray).m_capacity = iVar6;
        uVar7 = (this->m_valueArray).m_size;
      }
    }
    (this->m_valueArray).m_data[(int)uVar7] = *value;
    piVar5 = &(this->m_valueArray).m_size;
    *piVar5 = *piVar5 + 1;
    uVar7 = (this->m_keyArray).m_size;
    if (uVar7 == (this->m_keyArray).m_capacity) {
      iVar6 = 1;
      if (uVar7 != 0) {
        iVar6 = uVar7 * 2;
      }
      if ((int)uVar7 < iVar6) {
        if (iVar6 == 0) {
          pcVar9 = (cbtInternalVertexPair *)0x0;
        }
        else {
          pcVar9 = (cbtInternalVertexPair *)cbtAlignedAllocInternal((long)iVar6 << 2,0x10);
          uVar7 = (this->m_keyArray).m_size;
        }
        if (0 < (int)uVar7) {
          uVar10 = 0;
          do {
            pcVar9[uVar10] = (this->m_keyArray).m_data[uVar10];
            uVar10 = uVar10 + 1;
          } while (uVar7 != uVar10);
        }
        ptr_00 = (this->m_keyArray).m_data;
        if ((ptr_00 != (cbtInternalVertexPair *)0x0) && ((this->m_keyArray).m_ownsMemory == true)) {
          cbtAlignedFreeInternal(ptr_00);
        }
        (this->m_keyArray).m_ownsMemory = true;
        (this->m_keyArray).m_data = pcVar9;
        (this->m_keyArray).m_capacity = iVar6;
        uVar7 = (this->m_keyArray).m_size;
      }
    }
    (this->m_keyArray).m_data[(int)uVar7] = *key;
    piVar5 = &(this->m_keyArray).m_size;
    *piVar5 = *piVar5 + 1;
    if ((int)uVar11 < (this->m_valueArray).m_capacity) {
      growTables(this,key);
      uVar11 = (this->m_valueArray).m_capacity - 1U &
               (uint)(ushort)key->m_v1 * 0x10000 + (int)key->m_v0;
    }
    else {
      uVar11 = iVar3 - 1U & sVar2 * 0x10000 + (int)sVar1;
    }
    piVar5 = (this->m_hashTable).m_data;
    (this->m_next).m_data[(int)uVar4] = piVar5[(int)uVar11];
    piVar5[(int)uVar11] = uVar4;
  }
  else {
    (this->m_valueArray).m_data[iVar6] = *value;
  }
  return;
}

Assistant:

void insert(const Key& key, const Value& value)
	{
		int hash = key.getHash() & (m_valueArray.capacity() - 1);

		//replace value if the key is already there
		int index = findIndex(key);
		if (index != BT_HASH_NULL)
		{
			m_valueArray[index] = value;
			return;
		}

		int count = m_valueArray.size();
		int oldCapacity = m_valueArray.capacity();
		m_valueArray.push_back(value);
		m_keyArray.push_back(key);

		int newCapacity = m_valueArray.capacity();
		if (oldCapacity < newCapacity)
		{
			growTables(key);
			//hash with new capacity
			hash = key.getHash() & (m_valueArray.capacity() - 1);
		}
		m_next[count] = m_hashTable[hash];
		m_hashTable[hash] = count;
	}